

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CropFace.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  String local_1b8;
  Mat local_198 [96];
  undefined4 local_138;
  allocator<char> local_131;
  string local_130 [32];
  string local_110 [96];
  Mat local_b0 [8];
  Mat image;
  long local_a0;
  allocator<char> local_39;
  string local_38 [8];
  String output_path;
  char **argv_local;
  int argc_local;
  
  output_path.field_2._8_8_ = argv;
  if (argc == 2) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator(&local_39);
    std::__cxx11::string::operator+=(local_38,"_face.jpg");
    cv::Mat::Mat(local_b0);
    pcVar1 = *(char **)(output_path.field_2._8_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_130,pcVar1,&local_131);
    cv::imread(local_110,(int)local_130);
    cv::Mat::operator=(local_b0,(Mat *)local_110);
    cv::Mat::~Mat((Mat *)local_110);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator(&local_131);
    if (local_a0 == 0) {
      printf("No image data \n");
      argv_local._4_4_ = -1;
    }
    else {
      bVar2 = cv::CascadeClassifier::load((string *)cascade);
      if ((bVar2 & 1) == 0) {
        printf("--(!)Error loading face cascade\n");
        argv_local._4_4_ = -1;
      }
      else {
        cv::Mat::Mat(local_198,local_b0);
        std::__cxx11::string::string((string *)&local_1b8,local_38);
        detectAndSave(local_198,&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        cv::Mat::~Mat(local_198);
        argv_local._4_4_ = 0;
      }
    }
    local_138 = 1;
    cv::Mat::~Mat(local_b0);
    std::__cxx11::string::~string(local_38);
  }
  else {
    printf("usage: CropFace <Image_Path>\n");
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv ){
    if ( argc != 2 ){
        printf("usage: CropFace <Image_Path>\n");
        return -1;
    }
    String output_path = argv[1];
    output_path += "_face.jpg";

    Mat image;
    image = imread( argv[1], 1 );

    if ( !image.data ){
        printf("No image data \n");
        return -1;
    }

    // load cascades
    if( !cascade.load( face_cascade_name ) ){ printf("--(!)Error loading face cascade\n"); return -1; };
    detectAndSave( image, output_path );

    return 0;
}